

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O3

size_t __thiscall
CoreML::Specification::MILSpec::TensorValue_RepeatedLongInts::ByteSizeLong
          (TensorValue_RepeatedLongInts *this)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  ulong *puVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar3 = (this->values_).current_size_;
  uVar7 = 0;
  if ((int)uVar3 < 1) {
    lVar5 = 0;
  }
  else {
    lVar5 = 0;
    do {
      puVar4 = (ulong *)google::protobuf::RepeatedField<long>::Get(&this->values_,(int)uVar7);
      lVar2 = 0x3f;
      if ((*puVar4 | 1) != 0) {
        for (; (*puVar4 | 1) >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      lVar5 = lVar5 + (ulong)((int)lVar2 * 9 + 0x49U >> 6);
      uVar6 = (int)uVar7 + 1;
      uVar7 = (ulong)uVar6;
    } while (uVar3 != uVar6);
    if (lVar5 == 0) {
      lVar5 = 0;
      uVar7 = 0;
    }
    else if ((int)(uint)lVar5 < 0) {
      uVar7 = 0xb;
    }
    else {
      uVar3 = (uint)lVar5 | 1;
      iVar1 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar7 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
    }
  }
  this->_values_cached_byte_size_ = (int)lVar5;
  this->_cached_size_ = (int)(uVar7 + lVar5);
  return uVar7 + lVar5;
}

Assistant:

size_t TensorValue_RepeatedLongInts::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.MILSpec.TensorValue.RepeatedLongInts)
  size_t total_size = 0;

  // repeated int64 values = 1 [packed = true];
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      Int64Size(this->values_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _values_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}